

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::ClientImpl::~ClientImpl(ClientImpl *this)

{
  Socket *in_RDI;
  lock_guard<std::mutex> guard;
  ClientImpl *in_stack_fffffffffffffff0;
  
  *(undefined ***)in_RDI = &PTR__ClientImpl_002ccde0;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffff0,(mutex_type *)in_RDI);
  shutdown_socket(in_stack_fffffffffffffff0,in_RDI);
  close_socket(in_stack_fffffffffffffff0,in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x116aca);
  std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::~function
            ((function<void_(const_httplib::Request_&,_const_httplib::Response_&)> *)0x116ada);
  std::__cxx11::string::~string((string *)&in_RDI[0x37].ssl);
  std::__cxx11::string::~string((string *)&in_RDI[0x35].ssl);
  std::__cxx11::string::~string((string *)&in_RDI[0x33].ssl);
  std::__cxx11::string::~string((string *)&in_RDI[0x31].ssl);
  std::__cxx11::string::~string((string *)&in_RDI[0x2f].ssl);
  std::__cxx11::string::~string((string *)&in_RDI[0x2d].ssl);
  std::__cxx11::string::~string((string *)&in_RDI[0x2b].ssl);
  std::__cxx11::string::~string((string *)(in_RDI + 0x29));
  std::__cxx11::string::~string((string *)(in_RDI + 0x27));
  std::function<void_(int)>::~function((function<void_(int)> *)0x116b7a);
  std::__cxx11::string::~string((string *)&in_RDI[0x21].ssl);
  std::__cxx11::string::~string((string *)&in_RDI[0x1f].ssl);
  std::__cxx11::string::~string((string *)&in_RDI[0x1d].ssl);
  std::__cxx11::string::~string((string *)&in_RDI[0x1b].ssl);
  std::__cxx11::string::~string((string *)&in_RDI[0x19].ssl);
  std::__cxx11::string::~string((string *)&in_RDI[0x14].ssl);
  std::__cxx11::string::~string((string *)&in_RDI[0x12].ssl);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x116bfa);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x116c0a);
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  std::__cxx11::string::~string((string *)&in_RDI->ssl);
  return;
}

Assistant:

inline ClientImpl::~ClientImpl() {
        std::lock_guard<std::mutex> guard(socket_mutex_);
        shutdown_socket(socket_);
        close_socket(socket_);
    }